

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O1

pair<bool,_char> __thiscall HuffTree::walk(HuffTree *this,bool branch)

{
  pair<bool,_char> pVar1;
  HuffmanException *pHVar2;
  _Head_base<0UL,_HuffTree::TreeNode_*,_false> _Var3;
  undefined7 in_register_00000031;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000031,branch) == 0) {
    _Var3._M_head_impl =
         (this->curr_node->_left)._M_t.
         super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
         super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
         super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
    if (_Var3._M_head_impl == (TreeNode *)0x0) {
      pHVar2 = (HuffmanException *)__cxa_allocate_exception(0x28);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,
                 "Incorrect Huffman tree! (Check your input file for correctness!)","");
      HuffmanException::HuffmanException(pHVar2,&local_38);
      __cxa_throw(pHVar2,&HuffmanException::typeinfo,HuffmanException::~HuffmanException);
    }
  }
  else {
    _Var3._M_head_impl =
         (this->curr_node->_right)._M_t.
         super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
         super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
         super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
    if (_Var3._M_head_impl == (TreeNode *)0x0) {
      pHVar2 = (HuffmanException *)__cxa_allocate_exception(0x28);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,
                 "Incorrect Huffman tree! (Check your input file for correctness!)","");
      HuffmanException::HuffmanException(pHVar2,&local_38);
      __cxa_throw(pHVar2,&HuffmanException::typeinfo,HuffmanException::~HuffmanException);
    }
  }
  this->curr_node = _Var3._M_head_impl;
  pVar1.second = (_Var3._M_head_impl)->_data;
  pVar1.first = (_Var3._M_head_impl)->_is_leaf;
  return pVar1;
}

Assistant:

std::pair<bool, char> HuffTree::walk(bool branch) {
    if (branch) {
        if (!curr_node->_right) {
            throw HuffmanException("Incorrect Huffman tree! (Check your input file for correctness!)");
        }
        curr_node = curr_node->_right.get();
    } else {
        if (!curr_node->_left) {
            throw HuffmanException("Incorrect Huffman tree! (Check your input file for correctness!)");
        }
        curr_node = curr_node->_left.get();
    }
    return {curr_node->_is_leaf, curr_node->_data};
}